

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O2

apx_portInstance_t * apx_nodeInstance_find_port_by_name(apx_nodeInstance_t *self,char *name)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  apx_portInstance_t *paVar6;
  
  if (name != (char *)0x0 && self != (apx_nodeInstance_t *)0x0) {
    uVar1 = self->num_provide_ports;
    if (uVar1 != 0) {
      lVar4 = 0;
      for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
        paVar6 = (apx_portInstance_t *)((long)&self->provide_ports->pack_program + lVar4);
        pcVar3 = apx_portInstance_name(paVar6);
        if ((pcVar3 != (char *)0x0) && (iVar2 = strcmp(pcVar3,name), iVar2 == 0)) {
          return paVar6;
        }
        uVar1 = self->num_provide_ports;
        lVar4 = lVar4 + 0x58;
      }
    }
    uVar1 = self->num_require_ports;
    if (uVar1 != 0) {
      lVar4 = 0;
      for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
        paVar6 = (apx_portInstance_t *)((long)&self->require_ports->pack_program + lVar4);
        pcVar3 = apx_portInstance_name(paVar6);
        if ((pcVar3 != (char *)0x0) && (iVar2 = strcmp(pcVar3,name), iVar2 == 0)) {
          return paVar6;
        }
        uVar1 = self->num_require_ports;
        lVar4 = lVar4 + 0x58;
      }
    }
  }
  return (apx_portInstance_t *)0x0;
}

Assistant:

apx_portInstance_t* apx_nodeInstance_find_port_by_name(apx_nodeInstance_t const* self, char const* name)
{
   if ((self != NULL) && (name != NULL))
   {
      apx_size_t port_id;
      if (self->num_provide_ports > 0)
      {
         for (port_id = 0u; port_id < self->num_provide_ports; port_id++)
         {
            apx_portInstance_t* port_instance = &self->provide_ports[port_id];
            char const* port_name = apx_portInstance_name(port_instance);
            if ((port_name != NULL) && (strcmp(port_name, name) == 0))
            {
               return port_instance;
            }
         }
      }
      if (self->num_require_ports > 0)
      {
         for (port_id = 0u; port_id < self->num_require_ports; port_id++)
         {
            apx_portInstance_t* port_instance = &self->require_ports[port_id];
            char const* port_name = apx_portInstance_name(port_instance);
            if ((port_name != NULL) && (strcmp(port_name, name) == 0))
            {
               return port_instance;
            }
         }
      }
   }
   return NULL;
}